

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference pvVar1;
  idx_t in_RDX;
  byte in_SIL;
  DataChunk *in_RDI;
  hugeint_t in;
  hugeint_t addition;
  hugeint_t power_of_ten;
  size_type in_stack_ffffffffffffff88;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff90;
  anon_class_16_2_0b9647cc in_stack_ffffffffffffffa8;
  Vector local_48 [16];
  duckdb *local_38;
  uint64_t local_30;
  hugeint_t local_28;
  idx_t local_18;
  DataChunk *local_8;
  FunctionErrors errors;
  
  local_38 = (duckdb *)(&Hugeint::POWERS_OF_TEN)[(ulong)in_SIL * 2];
  local_30 = *(uint64_t *)(duckdb::Value::DoubleIsFinite + (ulong)in_SIL * 0x10);
  in.upper = in_RDX;
  in.lower = local_30;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_28 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(local_38,in);
  duckdb::hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffffa8,2);
  local_48 = (Vector  [16])
             duckdb::hugeint_t::operator/(&local_28,(hugeint_t *)&stack0xffffffffffffffa8);
  pvVar1 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  errors = (FunctionErrors)((ulong)pvVar1 >> 0x38);
  DataChunk::size(local_8);
  UnaryExecutor::
  Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            ((Vector *)&local_28,local_48,local_18,in_stack_ffffffffffffffa8,errors);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}